

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::outelements(tetgenmesh *this,tetgenio *out)

{
  uint uVar1;
  tetgenbehavior *ptVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  uint uVar8;
  size_t sVar9;
  double *pdVar10;
  FILE *__stream;
  tetrahedron *pppdVar11;
  ulong uVar12;
  long lVar13;
  undefined8 uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  int local_460;
  int local_458;
  double *local_450;
  int *local_448;
  char outelefilename [1024];
  
  if (out == (tetgenio *)0x0) {
    strcpy(outelefilename,this->b->outfilename);
    sVar9 = strlen(outelefilename);
    builtin_strncpy(outelefilename + sVar9,".ele",5);
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",outelefilename);
    }
    else {
      puts("Writing elements.");
    }
  }
  lVar17 = this->tetrahedrons->items - this->hullsize;
  uVar1 = this->numelemattrib;
  uVar18 = (ulong)uVar1;
  if (out == (tetgenio *)0x0) {
    __stream = fopen(outelefilename,"w");
    if (__stream == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",outelefilename);
      puts("Error:  Out of memory.");
      exit(1);
    }
    uVar14 = 10;
    if (this->b->order == 1) {
      uVar14 = 4;
    }
    local_450 = (double *)0x0;
    fprintf(__stream,"%ld  %d  %d\n",lVar17,uVar14,uVar18);
    local_448 = (int *)0x0;
  }
  else {
    ptVar2 = this->b;
    lVar13 = 10;
    if (ptVar2->order == 1) {
      lVar13 = 4;
    }
    local_448 = (int *)operator_new__(-(ulong)((ulong)(lVar13 * lVar17) >> 0x3e != 0) |
                                      lVar13 * lVar17 * 4);
    out->tetrahedronlist = local_448;
    if (0 < (int)uVar1) {
      pdVar10 = (double *)
                operator_new__(-(ulong)(lVar17 * uVar18 >> 0x3d != 0) | lVar17 * uVar18 * 8);
      out->tetrahedronattributelist = pdVar10;
    }
    out->numberoftetrahedra = (int)lVar17;
    iVar16 = 10;
    if (ptVar2->order == 1) {
      iVar16 = 4;
    }
    out->numberofcorners = iVar16;
    out->numberoftetrahedronattributes = uVar1;
    local_450 = out->tetrahedronattributelist;
    __stream = (FILE *)0x0;
  }
  uVar15 = 0;
  if (this->b->zeroindex == 0) {
    uVar15 = this->in->firstnumber;
  }
  pmVar3 = this->tetrahedrons;
  iVar16 = this->in->firstnumber;
  ppvVar4 = pmVar3->firstblock;
  pmVar3->pathblock = ppvVar4;
  pmVar3->pathitem =
       (void *)((long)ppvVar4 +
               (((long)pmVar3->alignbytes + 8U) -
               (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
  pmVar3->pathitemsleft = pmVar3->itemsperblock;
  pppdVar11 = tetrahedrontraverse(this);
  if (pppdVar11 != (tetrahedron *)0x0) {
    uVar8 = (uint)(iVar16 == 1 && uVar15 == 0);
    local_458 = 0;
    local_460 = 0;
    do {
      ptVar2 = this->b;
      bVar19 = ptVar2->reversetetori == 0;
      ppdVar5 = pppdVar11[(ulong)bVar19 + 4];
      ppdVar6 = pppdVar11[6];
      ppdVar7 = pppdVar11[7];
      if (out == (tetgenio *)0x0) {
        lVar17 = (long)this->pointmarkindex;
        fprintf(__stream,"%5d   %5d %5d %5d %5d",(ulong)uVar15,
                (ulong)(*(int *)((long)pppdVar11[(ulong)!bVar19 + 4] + lVar17 * 4) - uVar8),
                (ulong)(*(int *)((long)ppdVar5 + lVar17 * 4) - uVar8),
                (ulong)(*(int *)((long)ppdVar6 + lVar17 * 4) - uVar8),
                (ulong)(*(int *)((long)ppdVar7 + lVar17 * 4) - uVar8));
        if (this->b->order == 2) {
          ppdVar5 = pppdVar11[0xb];
          lVar17 = (long)this->pointmarkindex;
          fprintf(__stream,"  %5d %5d %5d %5d %5d %5d",
                  (ulong)(*(int *)((long)*ppdVar5 + lVar17 * 4) - uVar8),
                  (ulong)(*(int *)((long)ppdVar5[1] + lVar17 * 4) - uVar8),
                  (ulong)(*(int *)((long)ppdVar5[2] + lVar17 * 4) - uVar8),
                  (ulong)(*(int *)((long)ppdVar5[3] + lVar17 * 4) - uVar8),
                  (ulong)(*(int *)((long)ppdVar5[4] + lVar17 * 4) - uVar8),
                  (ulong)(*(int *)((long)ppdVar5[5] + lVar17 * 4) - uVar8));
        }
        if (0 < (int)uVar1) {
          lVar17 = 0;
          do {
            fprintf(__stream,"    %.17g",pppdVar11[this->elemattribindex + lVar17]);
            lVar17 = lVar17 + 1;
          } while (uVar1 != (uint)lVar17);
        }
        fputc(10,__stream);
      }
      else {
        lVar17 = (long)local_460;
        local_448[lVar17] =
             *(int *)((long)pppdVar11[(ulong)!bVar19 + 4] + (long)this->pointmarkindex * 4) - uVar8;
        local_448[lVar17 + 1] = *(int *)((long)ppdVar5 + (long)this->pointmarkindex * 4) - uVar8;
        local_448[lVar17 + 2] = *(int *)((long)ppdVar6 + (long)this->pointmarkindex * 4) - uVar8;
        iVar16 = local_460 + 4;
        local_448[lVar17 + 3] = *(int *)((long)ppdVar7 + (long)this->pointmarkindex * 4) - uVar8;
        if (ptVar2->order == 2) {
          ppdVar5 = pppdVar11[0xb];
          local_448[iVar16] = *(int *)((long)*ppdVar5 + (long)this->pointmarkindex * 4) - uVar8;
          local_448[lVar17 + 5] =
               *(int *)((long)ppdVar5[1] + (long)this->pointmarkindex * 4) - uVar8;
          local_448[lVar17 + 6] =
               *(int *)((long)ppdVar5[2] + (long)this->pointmarkindex * 4) - uVar8;
          local_448[lVar17 + 7] =
               *(int *)((long)ppdVar5[3] + (long)this->pointmarkindex * 4) - uVar8;
          local_448[lVar17 + 8] =
               *(int *)((long)ppdVar5[4] + (long)this->pointmarkindex * 4) - uVar8;
          iVar16 = local_460 + 10;
          local_448[lVar17 + 9] =
               *(int *)((long)ppdVar5[5] + (long)this->pointmarkindex * 4) - uVar8;
        }
        local_460 = iVar16;
        if (0 < (int)uVar1) {
          iVar16 = this->elemattribindex;
          uVar12 = 0;
          do {
            local_450[(long)local_458 + uVar12] = (double)pppdVar11[(long)iVar16 + uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar18 != uVar12);
          local_458 = local_458 + (int)uVar12;
        }
      }
      *(uint *)(pppdVar11 + 10) = uVar15;
      if (this->b->metric != 0) {
        iVar16 = this->point2simindex;
        lVar17 = 4;
        do {
          pppdVar11[lVar17][iVar16] = (double *)pppdVar11;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 8);
      }
      pppdVar11 = tetrahedrontraverse(this);
      uVar15 = uVar15 + 1;
    } while (pppdVar11 != (tetrahedron *)0x0);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(__stream,"# Generated by %s\n",this->b->commandline);
    fclose(__stream);
  }
  return;
}

Assistant:

void tetgenmesh::outelements(tetgenio* out)
{
  FILE *outfile = NULL;
  char outelefilename[FILENAMESIZE];
  tetrahedron* tptr;
  point p1, p2, p3, p4;
  point *extralist;
  REAL *talist = NULL;
  int *tlist = NULL;
  long ntets;
  int firstindex, shift;
  int pointindex, attribindex;
  int highorderindex = 11; 
  int elementnumber;
  int eextras;
  int i;

  if (out == (tetgenio *) NULL) {
    strcpy(outelefilename, b->outfilename);
    strcat(outelefilename, ".ele");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outelefilename);
    } else {
      printf("Writing elements.\n");
    }
  }

  // The number of tets excluding hull tets.
  ntets = tetrahedrons->items - hullsize;

  eextras = numelemattrib;
  if (out == (tetgenio *) NULL) {
    outfile = fopen(outelefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outelefilename);
      terminatetetgen(this, 1);
    }
    // Number of tetras, points per tetra, attributes per tetra.
    fprintf(outfile, "%ld  %d  %d\n", ntets, b->order == 1 ? 4 : 10, eextras);
  } else {
    // Allocate memory for output tetrahedra.
    out->tetrahedronlist = new int[ntets * (b->order == 1 ? 4 : 10)];
    if (out->tetrahedronlist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    // Allocate memory for output tetrahedron attributes if necessary.
    if (eextras > 0) {
      out->tetrahedronattributelist = new REAL[ntets * eextras];
      if (out->tetrahedronattributelist == (REAL *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    out->numberoftetrahedra = ntets;
    out->numberofcorners = b->order == 1 ? 4 : 10;
    out->numberoftetrahedronattributes = eextras;
    tlist = out->tetrahedronlist;
    talist = out->tetrahedronattributelist;
    pointindex = 0;
    attribindex = 0;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shift.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tptr = tetrahedrontraverse();
  elementnumber = firstindex; // in->firstnumber;
  while (tptr != (tetrahedron *) NULL) {
    if (!b->reversetetori) {
      p1 = (point) tptr[4];
      p2 = (point) tptr[5];
    } else {
      p1 = (point) tptr[5];
      p2 = (point) tptr[4];
    }
    p3 = (point) tptr[6];
    p4 = (point) tptr[7];
    if (out == (tetgenio *) NULL) {
      // Tetrahedron number, indices for four points.
      fprintf(outfile, "%5d   %5d %5d %5d %5d", elementnumber,
              pointmark(p1) - shift, pointmark(p2) - shift,
              pointmark(p3) - shift, pointmark(p4) - shift);
      if (b->order == 2) {
        extralist = (point *) tptr[highorderindex];
        // indices for six extra points.
        fprintf(outfile, "  %5d %5d %5d %5d %5d %5d",
          pointmark(extralist[0]) - shift, pointmark(extralist[1]) - shift,
          pointmark(extralist[2]) - shift, pointmark(extralist[3]) - shift,
          pointmark(extralist[4]) - shift, pointmark(extralist[5]) - shift);
      }
      for (i = 0; i < eextras; i++) {
        fprintf(outfile, "    %.17g", elemattribute(tptr, i));
      }
      fprintf(outfile, "\n");
    } else {
      tlist[pointindex++] = pointmark(p1) - shift;
      tlist[pointindex++] = pointmark(p2) - shift;
      tlist[pointindex++] = pointmark(p3) - shift;
      tlist[pointindex++] = pointmark(p4) - shift;
      if (b->order == 2) {
        extralist = (point *) tptr[highorderindex];
        tlist[pointindex++] = pointmark(extralist[0]) - shift;
        tlist[pointindex++] = pointmark(extralist[1]) - shift;
        tlist[pointindex++] = pointmark(extralist[2]) - shift;
        tlist[pointindex++] = pointmark(extralist[3]) - shift;
        tlist[pointindex++] = pointmark(extralist[4]) - shift;
        tlist[pointindex++] = pointmark(extralist[5]) - shift;
      }
      for (i = 0; i < eextras; i++) {
        talist[attribindex++] = elemattribute(tptr, i);
      }
    }
    // Remember the index of this element (for counting edges).
    setelemindex(tptr, elementnumber);
	if (b->metric) { // -m option
	  // Update the point-to-tet map, so that every point is pointing
	  //   to a real tet, not a fictious one. Used by .p2t file.
	  for (int i = 0; i < 4; i++) {
	    setpoint2tet((point) (tptr[4 + i]), (tetrahedron) tptr);
	  }
	}
    tptr = tetrahedrontraverse();
    elementnumber++;
  }


  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}